

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

int Acb_NtkComputeLevelR(Acb_Ntk_t *p,Vec_Int_t *vTfi)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  
  if ((p->vLevelR).nSize < 1) {
    uVar1 = (p->vObjType).nCap;
    if ((p->vLevelR).nCap < (int)uVar1) {
      piVar5 = (p->vLevelR).pArray;
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar5 = (int *)realloc(piVar5,(long)(int)uVar1 << 2);
      }
      (p->vLevelR).pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vLevelR).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((p->vLevelR).pArray,0,(ulong)uVar1 * 4);
    }
    (p->vLevelR).nSize = uVar1;
  }
  lVar6 = (long)vTfi->nSize;
  if (0 < (long)vTfi->nSize) {
    do {
      if (vTfi->nSize < lVar6) goto LAB_003b0ac5;
      Acb_ObjComputeLevelR(p,vTfi->pArray[lVar6 + -1]);
      bVar3 = 1 < lVar6;
      lVar6 = lVar6 + -1;
    } while (bVar3);
  }
  lVar6 = (long)(p->vCis).nSize;
  if (lVar6 < 1) {
    iVar4 = 0;
  }
  else {
    lVar7 = 0;
    iVar4 = 0;
    do {
      iVar2 = (p->vCis).pArray[lVar7];
      if ((long)iVar2 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0x114,"int Acb_ObjLevelR(Acb_Ntk_t *, int)");
      }
      if ((p->vLevelR).nSize <= iVar2) {
LAB_003b0ac5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = (p->vLevelR).pArray[iVar2];
      if (iVar4 <= iVar2) {
        iVar4 = iVar2;
      }
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  p->LevelMax = iVar4;
  return iVar4;
}

Assistant:

int Acb_NtkComputeLevelR( Acb_Ntk_t * p, Vec_Int_t * vTfi )
{
    // it is assumed that vTfi contains CI nodes
    int i, iObj, Level = 0;
    if ( !Acb_NtkHasObjLevelR( p ) )
        Acb_NtkCleanObjLevelR( p );
    Vec_IntForEachEntryReverse( vTfi, iObj, i )
        Acb_ObjComputeLevelR( p, iObj );
    Acb_NtkForEachCi( p, iObj, i )
        Level = Abc_MaxInt( Level, Acb_ObjLevelR(p, iObj) );
//    assert( p->LevelMax == Level );
    p->LevelMax = Level;
    return Level;
}